

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_non_temporal_memcpy.cc
# Opt level: O1

crc32c_t __thiscall
absl::lts_20240722::crc_internal::CrcNonTemporalMemcpyAVXEngine::Compute
          (CrcNonTemporalMemcpyAVXEngine *this,void *dst,void *src,size_t length,
          crc32c_t initial_crc)

{
  char *pcVar1;
  size_t final_copy_size;
  size_t len;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  string_view buf_to_add;
  string_view buf_to_add_00;
  
  pcVar1 = (char *)length;
  if (length < 0x2001) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    do {
      buf_to_add._M_str = pcVar1;
      buf_to_add._M_len = (size_t)((long)src + uVar3);
      initial_crc = ExtendCrc32cInternal
                              ((crc_internal *)(ulong)initial_crc.crc_,(crc32c_t)0x2000,buf_to_add);
      non_temporal_store_memcpy_avx((void *)((long)dst + uVar3),(void *)((long)src + uVar3),0x2000);
      uVar2 = uVar3 + 0x2000;
      uVar4 = uVar3 + 0x4000;
      uVar3 = uVar2;
    } while (uVar4 < length);
  }
  len = length - uVar2;
  if (uVar2 <= length && len != 0) {
    buf_to_add_00._M_str = pcVar1;
    buf_to_add_00._M_len = (size_t)((long)src + uVar2);
    initial_crc = ExtendCrc32cInternal
                            ((crc_internal *)(ulong)initial_crc.crc_,(uint32_t)len,buf_to_add_00);
    non_temporal_store_memcpy_avx((void *)((long)dst + uVar2),(void *)((long)src + uVar2),len);
  }
  return (crc32c_t)initial_crc.crc_;
}

Assistant:

crc32c_t CrcNonTemporalMemcpyAVXEngine::Compute(void* __restrict dst,
                                                const void* __restrict src,
                                                std::size_t length,
                                                crc32c_t initial_crc) const {
  constexpr size_t kBlockSize = 8192;
  crc32c_t crc = initial_crc;

  const char* src_bytes = reinterpret_cast<const char*>(src);
  char* dst_bytes = reinterpret_cast<char*>(dst);

  // Copy + CRC loop - run 8k chunks until we are out of full chunks.
  std::size_t offset = 0;
  for (; offset + kBlockSize < length; offset += kBlockSize) {
    crc = ExtendCrc32c(crc, absl::string_view(src_bytes + offset, kBlockSize));

    non_temporal_store_memcpy_avx(dst_bytes + offset, src_bytes + offset,
                                  kBlockSize);
  }

  // Save some work if length is 0.
  if (offset < length) {
    std::size_t final_copy_size = length - offset;
    crc = ExtendCrc32c(crc,
                       absl::string_view(src_bytes + offset, final_copy_size));

    non_temporal_store_memcpy_avx(dst_bytes + offset, src_bytes + offset,
                                  final_copy_size);
  }

  return crc;
}